

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionChannel::handleUnexpectedEOF(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  int *piVar2;
  QArrayData *pQVar3;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> tVar4;
  qsizetype qVar5;
  bool bVar6;
  undefined8 uVar7;
  int in_ESI;
  QObject *pQVar8;
  long in_FS_OFFSET;
  QString local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < *(int *)(this + 0x5c)) {
    bVar6 = QHttpNetworkRequest::methodIsIdempotent((QHttpNetworkRequest *)(this + 0x28));
    if (bVar6) {
      *(int *)(this + 0x5c) = *(int *)(this + 0x5c) + -1;
      QHttpNetworkReplyPrivate::clear(*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
      QWeakPointer<QObject>::operator=
                ((QWeakPointer<QObject> *)(*(long *)(*(long *)(this + 0x38) + 8) + 0x168),
                 (QWeakPointer<QObject> *)(this + 0xf0));
      lVar1 = *(long *)(*(long *)(this + 0x38) + 8);
      uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
      piVar2 = *(int **)(lVar1 + 0x178);
      *(undefined8 *)(lVar1 + 0x178) = uVar7;
      *(QHttpNetworkConnectionChannel **)(lVar1 + 0x180) = this;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          operator_delete(piVar2);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        closeAndResendCurrentRequest(this);
        return;
      }
      goto LAB_00205aa4;
    }
  }
  requeueCurrentlyPipelinedRequests(this);
  close(this,in_ESI);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QHttpNetworkConnectionPrivate::errorDetail
            (&local_38,*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
             RemoteHostClosedError,*(QIODevice **)(this + 0x10),&local_58);
  lVar1 = *(long *)(*(long *)(this + 0x38) + 8);
  pQVar3 = *(QArrayData **)(lVar1 + 0xf0);
  tVar4.ptr = *(QHttpNetworkRequestPrivate **)(lVar1 + 0xf8);
  *(Data **)(lVar1 + 0xf0) = local_38.d.d;
  ((totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> *)(lVar1 + 0xf8))->ptr =
       (QHttpNetworkRequestPrivate *)local_38.d.ptr;
  qVar5 = *(qsizetype *)(lVar1 + 0x100);
  *(qsizetype *)(lVar1 + 0x100) = local_38.d.size;
  local_38.d.d = (Data *)pQVar3;
  local_38.d.ptr = (char16_t *)tVar4.ptr;
  local_38.d.size = qVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QHttpNetworkReply::finishedWithError
            (*(QHttpNetworkReply **)(this + 0x38),RemoteHostClosedError,
             (QString *)(*(long *)(*(QHttpNetworkReply **)(this + 0x38) + 8) + 0xf0));
  *(undefined8 *)(this + 0x38) = 0;
  if (*(QAbstractProtocolHandler **)(this + 0x78) != (QAbstractProtocolHandler *)0x0) {
    QAbstractProtocolHandler::setReply
              (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
  }
  QUrl::QUrl((QUrl *)&local_58);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)&local_38,(QUrl *)&local_58,Get,NormalPriority);
  QHttpNetworkRequest::operator=
            ((QHttpNetworkRequest *)(this + 0x28),(QHttpNetworkRequest *)&local_38);
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)&local_38);
  QUrl::~QUrl((QUrl *)&local_58);
  if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = *(QObject **)(this + 0xf8);
  }
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  QMetaObject::invokeMethodImpl
            (pQVar8,"_q_startNextRequest",QueuedConnection,1,(void **)&local_38,
             (char **)&local_38.d.ptr,(QMetaTypeInterface **)&local_38.d.size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00205aa4:
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::handleUnexpectedEOF()
{
    Q_ASSERT(reply);
    if (reconnectAttempts <= 0 || !request.methodIsIdempotent()) {
        // too many errors reading/receiving/parsing the status, close the socket and emit error
        requeueCurrentlyPipelinedRequests();
        close();
        reply->d_func()->errorString = connection->d_func()->errorDetail(QNetworkReply::RemoteHostClosedError, socket);
        emit reply->finishedWithError(QNetworkReply::RemoteHostClosedError, reply->d_func()->errorString);
        reply = nullptr;
        if (protocolHandler)
            protocolHandler->setReply(nullptr);
        request = QHttpNetworkRequest();
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        reconnectAttempts--;
        reply->d_func()->clear();
        reply->d_func()->connection = connection;
        reply->d_func()->connectionChannel = this;
        closeAndResendCurrentRequest();
    }
}